

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int yypcontext_expected_tokens(yypcontext_t *yyctx,yysymbol_kind_t *yyarg,int yyargn)

{
  int iVar1;
  yysymbol_kind_t local_2c;
  yysymbol_kind_t yysym;
  int yyx;
  int yycount;
  int yyargn_local;
  yysymbol_kind_t *yyarg_local;
  yypcontext_t *yyctx_local;
  
  yysym = YYSYMBOL_YYEOF;
  local_2c = YYSYMBOL_YYEOF;
  do {
    if (YYSYMBOL_T_EOB < local_2c) {
      if (((yyarg != (yysymbol_kind_t *)0x0) && (yysym == YYSYMBOL_YYEOF)) && (0 < yyargn)) {
        *yyarg = YYSYMBOL_YYEMPTY;
      }
      return yysym;
    }
    if ((local_2c != YYSYMBOL_YYerror) && (local_2c != YYSYMBOL_YYUNDEF)) {
      iVar1 = yy_lac(yyctx->yyesa,yyctx->yyes,yyctx->yyes_capacity,yyctx->yyssp,local_2c);
      if (iVar1 == -2) {
        return -2;
      }
      if (iVar1 != 1) {
        if (yyarg != (yysymbol_kind_t *)0x0) {
          if (yysym == yyargn) {
            return 0;
          }
          yyarg[yysym] = local_2c;
        }
        yysym = yysym + YYSYMBOL_YYerror;
      }
    }
    local_2c = local_2c + YYSYMBOL_YYerror;
  } while( true );
}

Assistant:

static int
yypcontext_expected_tokens (const yypcontext_t *yyctx,
                            yysymbol_kind_t yyarg[], int yyargn)
{
  /* Actual size of YYARG. */
  int yycount = 0;

  int yyx;
  for (yyx = 0; yyx < YYNTOKENS; ++yyx)
    {
      yysymbol_kind_t yysym = YY_CAST (yysymbol_kind_t, yyx);
      if (yysym != YYSYMBOL_YYerror && yysym != YYSYMBOL_YYUNDEF)
        switch (yy_lac (yyctx->yyesa, yyctx->yyes, yyctx->yyes_capacity, yyctx->yyssp, yysym))
          {
          case YYENOMEM:
            return YYENOMEM;
          case 1:
            continue;
          default:
            if (!yyarg)
              ++yycount;
            else if (yycount == yyargn)
              return 0;
            else
              yyarg[yycount++] = yysym;
          }
    }
  if (yyarg && yycount == 0 && 0 < yyargn)
    yyarg[0] = YYSYMBOL_YYEMPTY;
  return yycount;
}